

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

Data * __thiscall
QTzTimeZonePrivate::previousTransition
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 beforeMSecsSinceEpoch)

{
  QTzTransitionRule *pQVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Data *pDVar5;
  undefined4 uVar8;
  long lVar6;
  QTzTransitionRule *pQVar7;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  Data *pDVar12;
  QTzTransitionTime *pQVar13;
  undefined1 *puVar14;
  undefined1 *puVar16;
  QTzTransitionTime *pQVar17;
  ulong uVar18;
  ulong uVar20;
  long in_FS_OFFSET;
  QTzTransitionRule rule;
  QTzTransitionRule rule_00;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_30;
  undefined1 *puVar15;
  ulong uVar19;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->cached_data).m_posixRule.d.size == 0) {
    uVar19 = (this->cached_data).m_tranTimes.d.size;
    if (0 < (long)uVar19) {
      pQVar17 = (this->cached_data).m_tranTimes.d.ptr;
      pQVar13 = pQVar17;
      goto LAB_003feb9f;
    }
LAB_003fec08:
    (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
    (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->abbreviation).d.size = 0;
    __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
    __return_storage_ptr__->offsetFromUtc = -0x80000000;
    __return_storage_ptr__->standardTimeOffset = -0x80000000;
    __return_storage_ptr__->daylightTimeOffset = -0x80000000;
  }
  else {
    uVar19 = (this->cached_data).m_tranTimes.d.size;
    if ((uVar19 != 0) &&
       (pQVar17 = (this->cached_data).m_tranTimes.d.ptr, pQVar13 = pQVar17,
       beforeMSecsSinceEpoch <= pQVar17[uVar19 - 1].atMSecsSinceEpoch)) {
LAB_003feb9f:
      do {
        uVar18 = uVar19 >> 1;
        uVar20 = uVar18;
        if (pQVar17[uVar18].atMSecsSinceEpoch < beforeMSecsSinceEpoch) {
          uVar20 = ~uVar18 + uVar19;
          pQVar17 = pQVar17 + uVar18 + 1;
        }
        uVar19 = uVar20;
      } while (0 < (long)uVar20);
      if (pQVar13 < pQVar17) {
        pQVar7 = (this->cached_data).m_tranRules.d.ptr;
        pQVar1 = pQVar7 + pQVar17[-1].ruleIndex;
        uVar3 = pQVar1->stdOffset;
        uVar8 = pQVar1->dstOffset;
        rule.dstOffset = uVar8;
        rule.stdOffset = uVar3;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          rule.abbreviationIndex = pQVar7[pQVar17[-1].ruleIndex].abbreviationIndex;
          rule._9_3_ = 0;
          dataFromRule(__return_storage_ptr__,this,rule,pQVar17[-1].atMSecsSinceEpoch);
          return __return_storage_ptr__;
        }
        goto LAB_003fece0;
      }
      goto LAB_003fec08;
    }
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions((QList<QTimeZonePrivate::Data> *)&local_48,this,beforeMSecsSinceEpoch);
    pDVar12 = local_48.ptr;
    puVar15 = (undefined1 *)local_48.size;
    if (local_48.size < 1) {
LAB_003fec31:
      lVar6 = (this->cached_data).m_tranTimes.d.size;
      if (lVar6 == 0) {
        (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
        (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
        (__return_storage_ptr__->abbreviation).d.size = 0;
        __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
        __return_storage_ptr__->offsetFromUtc = -0x80000000;
        __return_storage_ptr__->standardTimeOffset = -0x80000000;
        __return_storage_ptr__->daylightTimeOffset = -0x80000000;
      }
      else {
        pQVar17 = (this->cached_data).m_tranTimes.d.ptr;
        pQVar7 = (this->cached_data).m_tranRules.d.ptr;
        bVar2 = pQVar17[lVar6 + -1].ruleIndex;
        pQVar1 = pQVar7 + bVar2;
        uVar4 = pQVar1->stdOffset;
        uVar9 = pQVar1->dstOffset;
        rule_00.dstOffset = uVar9;
        rule_00.stdOffset = uVar4;
        pQVar7 = pQVar7 + bVar2;
        rule_00.abbreviationIndex = pQVar7->abbreviationIndex;
        rule_00._9_3_ = *(undefined3 *)&pQVar7->field_0x9;
        dataFromRule(__return_storage_ptr__,this,rule_00,pQVar17[lVar6 + -1].atMSecsSinceEpoch);
      }
    }
    else {
      do {
        puVar14 = (undefined1 *)((ulong)puVar15 >> 1);
        puVar16 = puVar14;
        if (pDVar12[(long)puVar14].atMSecsSinceEpoch < beforeMSecsSinceEpoch) {
          puVar16 = puVar15 + ~(ulong)puVar14;
          pDVar12 = pDVar12 + (long)(puVar14 + 1);
        }
        puVar15 = puVar16;
      } while (0 < (long)puVar16);
      if (pDVar12 <= local_48.ptr) goto LAB_003fec31;
      pDVar5 = pDVar12[-1].abbreviation.d.d;
      (__return_storage_ptr__->abbreviation).d.d = pDVar5;
      (__return_storage_ptr__->abbreviation).d.ptr = pDVar12[-1].abbreviation.d.ptr;
      (__return_storage_ptr__->abbreviation).d.size = pDVar12[-1].abbreviation.d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      __return_storage_ptr__->daylightTimeOffset = pDVar12[-1].daylightTimeOffset;
      iVar10 = pDVar12[-1].offsetFromUtc;
      iVar11 = pDVar12[-1].standardTimeOffset;
      __return_storage_ptr__->atMSecsSinceEpoch = pDVar12[-1].atMSecsSinceEpoch;
      __return_storage_ptr__->offsetFromUtc = iVar10;
      __return_storage_ptr__->standardTimeOffset = iVar11;
    }
    QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_003fece0:
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::previousTransition(qint64 beforeMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < beforeMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(beforeMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [beforeMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch < beforeMSecsSinceEpoch;
                                       });
        if (it > posixTrans.cbegin())
            return *--it;
        // It fell between the last transition (if any) and the first of the POSIX rule:
        return tranCache().isEmpty() ? Data{} : dataForTzTransition(tranCache().last());
    }

    // Otherwise if we can find a valid tran then use its rule
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [beforeMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch < beforeMSecsSinceEpoch;
                                     });
    return last > tranCache().cbegin() ? dataForTzTransition(*--last) : Data{};
}